

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClearDragDrop(void)

{
  int *piVar1;
  uchar *puVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *ctx;
  
  pIVar3 = GImGui;
  GImGui->DragDropActive = false;
  (pIVar3->DragDropPayload).Data = (void *)0x0;
  (pIVar3->DragDropPayload).DataSize = 0;
  (pIVar3->DragDropPayload).SourceId = 0;
  (pIVar3->DragDropPayload).SourceParentId = 0;
  (pIVar3->DragDropPayload).DataFrameCount = -1;
  (pIVar3->DragDropPayload).DataType[0] = '\0';
  (pIVar3->DragDropPayload).DataType[1] = '\0';
  (pIVar3->DragDropPayload).DataType[2] = '\0';
  (pIVar3->DragDropPayload).DataType[3] = '\0';
  (pIVar3->DragDropPayload).DataType[4] = '\0';
  (pIVar3->DragDropPayload).DataType[5] = '\0';
  (pIVar3->DragDropPayload).DataType[6] = '\0';
  (pIVar3->DragDropPayload).DataType[7] = '\0';
  (pIVar3->DragDropPayload).DataType[8] = '\0';
  (pIVar3->DragDropPayload).DataType[9] = '\0';
  (pIVar3->DragDropPayload).DataType[10] = '\0';
  (pIVar3->DragDropPayload).DataType[0xb] = '\0';
  (pIVar3->DragDropPayload).DataType[0xc] = '\0';
  (pIVar3->DragDropPayload).DataType[0xd] = '\0';
  (pIVar3->DragDropPayload).DataType[0xe] = '\0';
  (pIVar3->DragDropPayload).DataType[0xf] = '\0';
  (pIVar3->DragDropPayload).DataType[0x10] = '\0';
  (pIVar3->DragDropPayload).DataType[0x11] = '\0';
  (pIVar3->DragDropPayload).DataType[0x12] = '\0';
  (pIVar3->DragDropPayload).DataType[0x13] = '\0';
  (pIVar3->DragDropPayload).DataType[0x14] = '\0';
  (pIVar3->DragDropPayload).DataType[0x15] = '\0';
  (pIVar3->DragDropPayload).DataType[0x16] = '\0';
  (pIVar3->DragDropPayload).DataType[0x17] = '\0';
  (pIVar3->DragDropPayload).DataType[0x18] = '\0';
  (pIVar3->DragDropPayload).DataType[0x19] = '\0';
  (pIVar3->DragDropPayload).DataType[0x1a] = '\0';
  (pIVar3->DragDropPayload).DataType[0x1b] = '\0';
  (pIVar3->DragDropPayload).DataType[0x1c] = '\0';
  (pIVar3->DragDropPayload).DataType[0x1d] = '\0';
  (pIVar3->DragDropPayload).DataType[0x1e] = '\0';
  (pIVar3->DragDropPayload).DataType[0x1f] = '\0';
  (pIVar3->DragDropPayload).DataType[0x20] = '\0';
  (pIVar3->DragDropPayload).Preview = false;
  (pIVar3->DragDropPayload).Delivery = false;
  pIVar3->DragDropAcceptFlags = 0;
  pIVar3->DragDropAcceptIdPrev = 0;
  pIVar3->DragDropAcceptFrameCount = -1;
  pIVar3->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar3->DragDropAcceptIdCurr = 0;
  puVar2 = (pIVar3->DragDropPayloadBufHeap).Data;
  if (puVar2 != (uchar *)0x0) {
    (pIVar3->DragDropPayloadBufHeap).Size = 0;
    (pIVar3->DragDropPayloadBufHeap).Capacity = 0;
    if (pIVar3 != (ImGuiContext *)0x0) {
      piVar1 = &(pIVar3->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    (pIVar3->DragDropPayloadBufHeap).Data = (uchar *)0x0;
  }
  pIVar3->DragDropPayloadBufLocal[0] = '\0';
  pIVar3->DragDropPayloadBufLocal[1] = '\0';
  pIVar3->DragDropPayloadBufLocal[2] = '\0';
  pIVar3->DragDropPayloadBufLocal[3] = '\0';
  pIVar3->DragDropPayloadBufLocal[4] = '\0';
  pIVar3->DragDropPayloadBufLocal[5] = '\0';
  pIVar3->DragDropPayloadBufLocal[6] = '\0';
  pIVar3->DragDropPayloadBufLocal[7] = '\0';
  pIVar3->DragDropPayloadBufLocal[8] = '\0';
  pIVar3->DragDropPayloadBufLocal[9] = '\0';
  pIVar3->DragDropPayloadBufLocal[10] = '\0';
  pIVar3->DragDropPayloadBufLocal[0xb] = '\0';
  pIVar3->DragDropPayloadBufLocal[0xc] = '\0';
  pIVar3->DragDropPayloadBufLocal[0xd] = '\0';
  pIVar3->DragDropPayloadBufLocal[0xe] = '\0';
  pIVar3->DragDropPayloadBufLocal[0xf] = '\0';
  return;
}

Assistant:

void ImGui::ClearDragDrop()
{
    ImGuiContext& g = *GImGui;
    g.DragDropActive = false;
    g.DragDropPayload.Clear();
    g.DragDropAcceptFlags = ImGuiDragDropFlags_None;
    g.DragDropAcceptIdCurr = g.DragDropAcceptIdPrev = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropAcceptFrameCount = -1;

    g.DragDropPayloadBufHeap.clear();
    memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
}